

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_77::AsyncTee::~AsyncTee(AsyncTee *this)

{
  long lVar1;
  Fault f;
  Fault local_20;
  
  if ((this->branches[0].ptr.isSet != false) || (this->branches[1].ptr.isSet == true)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ba,FAILED,"!hasBranches","\"destroying AsyncTee with branch still alive\"",
               (char (*) [44])"destroying AsyncTee with branch still alive");
    _::Debug::Fault::~Fault(&local_20);
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&this->pullPromise);
  Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_>::~Maybe
            (&this->stoppage);
  lVar1 = 0x98;
  do {
    Maybe<kj::(anonymous_namespace)::AsyncTee::Branch>::~Maybe
              ((Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> *)
               ((long)this->branches + lVar1 + -0x38));
    lVar1 = lVar1 + -0x60;
  } while (lVar1 != -0x28);
  Own<kj::AsyncInputStream>::dispose(&this->inner);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~AsyncTee() noexcept(false) {
    bool hasBranches = false;
    for (auto& branch: branches) {
      hasBranches = hasBranches || branch != nullptr;
    }
    KJ_ASSERT(!hasBranches, "destroying AsyncTee with branch still alive") {
      // Don't std::terminate().
      break;
    }
  }